

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall QListModeViewBase::horizontalOffset(QListModeViewBase *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  ScrollMode SVar4;
  Flow FVar5;
  const_reference piVar6;
  QCommonListViewBase *in_RDI;
  long in_FS_OFFSET;
  int maximum_1;
  int position_1;
  int maximum;
  int maximumValue;
  int position;
  int currentValue;
  int max;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QCommonListViewBase *in_stack_ffffffffffffff90;
  QListView **this_00;
  int *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  int local_4c;
  int local_20;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  SVar4 = QCommonListViewBase::horizontalScrollMode((QCommonListViewBase *)0x88240a);
  if (SVar4 == ScrollPerItem) {
    bVar3 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x88241d);
    if (bVar3) {
      FVar5 = QCommonListViewBase::flow(in_RDI);
      if ((FVar5 == TopToBottom) && (bVar3 = QList<int>::isEmpty((QList<int> *)0x882447), !bVar3)) {
        QList<int>::size((QList<int> *)&in_RDI[1].contentsSize);
        QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x882477);
        QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff90);
        qBound<int>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                    (int *)in_stack_ffffffffffffff90);
        piVar6 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff90,
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        local_4c = *piVar6;
        QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x8824c8);
        QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff90);
        qBound<int>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                    (int *)in_stack_ffffffffffffff90);
        piVar6 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff90,
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        iVar1 = *piVar6;
        bVar3 = QCommonListViewBase::isRightToLeft((QCommonListViewBase *)0x882511);
        if (bVar3) {
          local_4c = iVar1 - local_4c;
        }
        local_20 = local_4c;
        goto LAB_00882642;
      }
    }
    else {
      FVar5 = QCommonListViewBase::flow(in_RDI);
      if ((FVar5 == LeftToRight) && (bVar3 = QList<int>::isEmpty((QList<int> *)0x882560), !bVar3)) {
        this_00 = &in_RDI[3].qq;
        QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x88258c);
        QAbstractSlider::value((QAbstractSlider *)this_00);
        QList<int>::at((QList<int> *)this_00,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        piVar6 = QList<int>::at((QList<int> *)this_00,
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        local_20 = *piVar6;
        QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x8825d8);
        QAbstractSlider::maximum((QAbstractSlider *)this_00);
        QList<int>::at((QList<int> *)this_00,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        piVar6 = QList<int>::at((QList<int> *)this_00,
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        iVar1 = *piVar6;
        bVar3 = QCommonListViewBase::isRightToLeft((QCommonListViewBase *)0x88260a);
        if (bVar3) {
          local_20 = iVar1 - local_20;
        }
        goto LAB_00882642;
      }
    }
  }
  local_20 = QCommonListViewBase::horizontalOffset(in_stack_ffffffffffffff90);
LAB_00882642:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

int QListModeViewBase::horizontalOffset() const
{
    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
        if (isWrapping()) {
            if (flow() == QListView::TopToBottom && !segmentPositions.isEmpty()) {
                const int max = segmentPositions.size() - 1;
                int currentValue = qBound(0, horizontalScrollBar()->value(), max);
                int position = segmentPositions.at(currentValue);
                int maximumValue = qBound(0, horizontalScrollBar()->maximum(), max);
                int maximum = segmentPositions.at(maximumValue);
                return (isRightToLeft() ? maximum - position : position);
            }
        } else if (flow() == QListView::LeftToRight && !flowPositions.isEmpty()) {
            int position = flowPositions.at(scrollValueMap.at(horizontalScrollBar()->value()));
            int maximum = flowPositions.at(scrollValueMap.at(horizontalScrollBar()->maximum()));
            return (isRightToLeft() ? maximum - position : position);
        }
    }
    return QCommonListViewBase::horizontalOffset();
}